

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

string_view __thiscall
google::protobuf::Reflection::ScratchSpace::CopyFromCord(ScratchSpace *this,Cord *cord)

{
  byte bVar1;
  Nonnull<CordRep_*> rep;
  bool bVar2;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  string_view sVar4;
  string_view fragment;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  rep = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (rep == (Nonnull<CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      local_28._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
      local_28._M_len = (ulong)(long)(char)bVar1 >> 1;
    }
    else {
      local_28._M_len = rep->length;
      local_28._M_str = (char *)0x0;
    }
  }
  else {
    local_28._M_len = 0;
    local_28._M_str = (char *)0x0;
    bVar2 = absl::lts_20250127::Cord::GetFlatAux(rep,&local_28);
    if (!bVar2) {
      _Var3._M_head_impl =
           (this->buffer_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (_Var3._M_head_impl == (Nonnull<std::string_*>)0x0) {
        _Var3._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
        ;
        (_Var3._M_head_impl)->_M_dataplus = (_Alloc_hider)&(_Var3._M_head_impl)->field_2;
        (_Var3._M_head_impl)->_M_string_length = 0;
        ((_Var3._M_head_impl)->field_2)._M_local_buf[0] = '\0';
        (this->buffer_)._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl = _Var3._M_head_impl;
      }
      absl::lts_20250127::CopyCordToString(cord,_Var3._M_head_impl);
      _Var3._M_head_impl =
           (this->buffer_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_28._M_str = ((_Var3._M_head_impl)->_M_dataplus)._M_p;
      local_28._M_len = (_Var3._M_head_impl)->_M_string_length;
    }
  }
  sVar4._M_str = local_28._M_str;
  sVar4._M_len = local_28._M_len;
  return sVar4;
}

Assistant:

absl::string_view CopyFromCord(const absl::Cord& cord) {
      if (absl::optional<absl::string_view> flat = cord.TryFlat()) {
        return *flat;
      }
      if (!buffer_) {
        buffer_ = absl::make_unique<std::string>();
      }
      absl::CopyCordToString(cord, buffer_.get());
      return *buffer_;
    }